

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.cpp
# Opt level: O0

czstring pstore::threads::get_name(span<char,_16L> name)

{
  pointer peVar1;
  pthread_t __target_thread;
  reference peVar2;
  errno_erc local_30;
  int local_2c;
  undefined8 uStack_28;
  int err;
  unsigned_long length_u;
  undefined8 local_18;
  index_type length;
  span<char,_16L> name_local;
  
  local_18 = 0x10;
  length = (index_type)name.storage_.data_;
  peVar1 = gsl::span<char,_16L>::data((span<char,_16L> *)&length);
  if (peVar1 == (pointer)0x0) {
    errno_erc::errno_erc((errno_erc *)((long)&length_u + 4),0x16);
    raise<pstore::errno_erc>(length_u._4_4_);
  }
  uStack_28 = 0x10;
  local_2c = 0;
  __target_thread = pthread_self();
  peVar1 = gsl::span<char,_16L>::data((span<char,_16L> *)&length);
  local_2c = pthread_getname_np(__target_thread,peVar1,0x10);
  if (local_2c != 0) {
    errno_erc::errno_erc(&local_30,local_2c);
    raise<pstore::errno_erc,char[18]>(local_30,(char (*) [18])"threads::get_name");
  }
  peVar2 = gsl::span<char,_16L>::operator[]((span<char,_16L> *)&length,0xf);
  *peVar2 = '\0';
  peVar1 = gsl::span<char,_16L>::data((span<char,_16L> *)&length);
  return peVar1;
}

Assistant:

gsl::czstring get_name (gsl::span<char, name_size> const name /*out*/) {
            auto const length = name.size ();
            if (name.data () == nullptr || length < 1) {
                raise (errno_erc{EINVAL});
            }

            PSTORE_ASSERT (length == name.size_bytes ());
            auto const length_u = unsigned_cast (length);
            int err = 0;
#    if USE_FALLBACK
            std::strncpy (name.data (), thread_name, length_u);
#    elif defined(PSTORE_PTHREAD_GETNAME_NP)
            err = pthread_getname_np (pthread_self (), name.data (), length_u);
#    elif defined(PSTORE_PTHREAD_GET_NAME_NP)
            pthread_get_name_np (pthread_self (), name.data (), length_u);
#    else
#        error "Don't know how to get the name of the current thread"
#    endif
            if (err != 0) {
                raise (errno_erc{err}, "threads::get_name");
            }
            name[length - 1] = '\0';
            return name.data ();
        }